

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O3

void __thiscall pele::physics::pltfilemanager::PltFileManager::readPlotFile(PltFileManager *this)

{
  undefined8 *puVar1;
  pointer pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pMVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 local_98 [32];
  undefined8 uStack_78;
  long local_68;
  long local_60;
  long local_58;
  string local_50;
  
  if (0 < this->m_nlevels) {
    local_60 = 0;
    lVar8 = 0;
    lVar6 = 0;
    lVar7 = 0;
    do {
      readLevelBoxArray(this,(int)lVar7,
                        (BoxArray *)
                        ((long)&(((this->m_grids).
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                        lVar6));
      local_68 = lVar6;
      amrex::DistributionMapping::DistributionMapping
                ((DistributionMapping *)local_98,
                 (BoxArray *)
                 ((long)&(((this->m_grids).
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar6),
                 *(int *)(amrex::ParallelContext::frames + 0x10));
      uVar5 = local_98._8_8_;
      uVar4 = local_98._0_8_;
      pDVar2 = (this->m_dmaps).
               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               .
               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_98._0_8_ = (pointer)0x0;
      local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(pDVar2->m_ref).
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                 + lVar8 + 8);
      puVar1 = (undefined8 *)
               ((long)&(pDVar2->m_ref).
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
               + lVar8);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      local_58 = lVar8;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      lVar6 = local_60;
      pMVar3 = (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_98._0_8_ = (pointer)0x1;
      local_98._24_8_ = 0;
      uStack_78 = 0;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      local_50._M_dataplus._M_p = (pointer)&PTR__FabFactory_00712918;
      (**(code **)(*(long *)((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                            local_60) + 0x10))
                ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_60,
                 (long)&(((this->m_grids).
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + local_68,
                 (long)&(((this->m_dmaps).
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          .
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                 + local_58,this->m_nvars,0,(string *)local_98,&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_98 + 0x10));
      pMVar3 = (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Cell","");
      amrex::MultiFabFileFullPrefix
                ((string *)local_98,(int)lVar7,&this->m_pltFile,
                 (string *)&(anonymous_namespace)::level_prefix_abi_cxx11_,&local_50);
      lVar8 = local_58;
      amrex::VisMF::Read((FabArray<amrex::FArrayBox> *)
                         ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                         lVar6),(string *)local_98,(char *)0x0,0,0);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
      lVar6 = local_68 + 0x68;
      lVar8 = lVar8 + 0x10;
      local_60 = local_60 + 0x180;
    } while (lVar7 < this->m_nlevels);
  }
  return;
}

Assistant:

void
PltFileManager::readPlotFile()
{
  // Set BoxArray, DistMap on each level and load data
  // TODO: only load a subset of the pltfile variables
  for (int lev = 0; lev < m_nlevels; ++lev) {
    readLevelBoxArray(lev, m_grids[lev]);
    m_dmaps[lev] = DistributionMapping(m_grids[lev]);
    m_data[lev].define(m_grids[lev], m_dmaps[lev], m_nvars, 0);
    VisMF::Read(
      m_data[lev],
      MultiFabFileFullPrefix(lev, m_pltFile, level_prefix, "Cell"));
  }
}